

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O3

void __thiscall chrono::ChBody::VariablesQbSetSpeed(ChBody *this,double step)

{
  ChBodyFrame *pCVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  ChVector<double> v;
  double local_f8;
  double dStack_f0;
  double dStack_e8;
  ChVectorRef *pCStack_e0;
  undefined8 local_d8;
  long local_c8;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double dStack_98;
  double dStack_90;
  double local_88;
  long local_80;
  ChVector<double> local_70;
  double local_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  
  local_b8 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[0];
  dStack_b0 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[1];
  dVar2 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
  local_58 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[0];
  dStack_50 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[1];
  dStack_48 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[2];
  dStack_40 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.m_data[3];
  local_a8 = step;
  ChVariables::Get_qb((ChVectorRef *)&local_88,(ChVariables *)&this->variables);
  local_f8 = local_88;
  dStack_f0 = 1.48219693752374e-323;
  local_d8 = 0;
  local_c8 = local_80;
  if (2 < local_80) {
    pCVar1 = &this->super_ChBodyFrame;
    pCStack_e0 = (ChVectorRef *)&local_88;
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_70,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_f8,(type *)0x0);
    (*(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[7])
              (pCVar1,&local_70);
    ChVariables::Get_qb((ChVectorRef *)&local_88,(ChVariables *)&this->variables);
    local_f8 = (double)((long)local_88 + 0x18);
    dStack_f0 = 1.48219693752374e-323;
    local_d8 = 3;
    local_c8 = local_80;
    if (5 < local_80) {
      pCStack_e0 = (ChVectorRef *)&local_88;
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_70,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_f8,(type *)0x0);
      (*(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame[9]
      )(pCVar1,&local_70);
      ClampSpeed(this);
      ComputeGyro(this);
      if ((local_a8 != 0.0) || (NAN(local_a8))) {
        local_a8 = 1.0 / local_a8;
        auVar3._8_8_ = dStack_b0;
        auVar3._0_8_ = local_b8;
        auVar3 = vsubpd_avx(*(undefined1 (*) [16])
                             (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.
                             m_data,auVar3);
        dStack_e8 = local_a8 *
                    ((this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2] -
                    dVar2);
        local_f8 = local_a8 * auVar3._0_8_;
        dStack_f0 = local_a8 * auVar3._8_8_;
        dStack_a0 = local_a8;
        dStack_98 = local_a8;
        dStack_90 = local_a8;
        (*(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame
          [0xc])(pCVar1,&local_f8);
        auVar4._8_8_ = dStack_50;
        auVar4._0_8_ = local_58;
        auVar4._16_8_ = dStack_48;
        auVar4._24_8_ = dStack_40;
        auVar4 = vsubpd_avx(*(undefined1 (*) [32])
                             (this->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.rot.
                             m_data,auVar4);
        local_f8 = auVar4._0_8_ * local_a8;
        dStack_f0 = auVar4._8_8_ * dStack_a0;
        dStack_e8 = auVar4._16_8_ * dStack_98;
        pCStack_e0 = (ChVectorRef *)(auVar4._24_8_ * dStack_90);
        (*(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame
          [0xd])(pCVar1,&local_f8);
      }
      return;
    }
  }
  dStack_f0 = 1.48219693752374e-323;
  pCStack_e0 = (ChVectorRef *)&local_88;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChBody::VariablesQbSetSpeed(double step) {
    ChCoordsys<> old_coord_dt = this->GetCoord_dt();

    // from 'qb' vector, sets body speed, and updates auxiliary data
    this->SetPos_dt(this->variables.Get_qb().segment(0, 3));
    this->SetWvel_loc(this->variables.Get_qb().segment(3, 3));

    // apply limits (if in speed clamping mode) to speeds.
    ClampSpeed();

    // compute auxiliary gyroscopic forces
    ComputeGyro();

    // Compute accel. by BDF (approximate by differentiation);
    if (step) {
        this->SetPos_dtdt((this->GetCoord_dt().pos - old_coord_dt.pos) / step);
        this->SetRot_dtdt((this->GetCoord_dt().rot - old_coord_dt.rot) / step);
    }
}